

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

RowSetEntry * rowSetListToTree(RowSetEntry *pList)

{
  RowSetEntry *pRVar1;
  int iDepth;
  RowSetEntry *pRVar2;
  long in_FS_OFFSET;
  RowSetEntry *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar1 = pList->pRight;
  pList->pRight = (RowSetEntry *)0x0;
  pList->pLeft = (RowSetEntry *)0x0;
  if (pRVar1 != (RowSetEntry *)0x0) {
    iDepth = 1;
    pRVar2 = pList;
    do {
      pList = pRVar1;
      local_28 = pList->pRight;
      pList->pLeft = pRVar2;
      pRVar1 = rowSetNDeepTree(&local_28,iDepth);
      pList->pRight = pRVar1;
      iDepth = iDepth + 1;
      pRVar1 = local_28;
      pRVar2 = pList;
    } while (local_28 != (RowSetEntry *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return pList;
}

Assistant:

static struct RowSetEntry *rowSetListToTree(struct RowSetEntry *pList){
  int iDepth;           /* Depth of the tree so far */
  struct RowSetEntry *p;       /* Current tree root */
  struct RowSetEntry *pLeft;   /* Left subtree */

  assert( pList!=0 );
  p = pList;
  pList = p->pRight;
  p->pLeft = p->pRight = 0;
  for(iDepth=1; pList; iDepth++){
    pLeft = p;
    p = pList;
    pList = p->pRight;
    p->pLeft = pLeft;
    p->pRight = rowSetNDeepTree(&pList, iDepth);
  }
  return p;
}